

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O2

bool argparse::Argument::is_positional(string_view name,string_view prefix_chars)

{
  bool bVar1;
  size_type sVar2;
  size_t sVar3;
  string_view s;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  local_28._M_str = prefix_chars._M_str;
  local_28._M_len = prefix_chars._M_len;
  bVar1 = true;
  if (name._M_len != 0) {
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_28,*name._M_str,0);
    if ((sVar2 != 0xffffffffffffffff) && (sVar3 = name._M_len - 1, sVar3 != 0)) {
      s._M_str = name._M_str + 1;
      s._M_len = sVar3;
      bVar1 = is_decimal_literal(s);
    }
  }
  return bVar1;
}

Assistant:

static bool is_positional(std::string_view name,
                            std::string_view prefix_chars) {
    auto first = lookahead(name);

    if (first == eof) {
      return true;
    } else if (prefix_chars.find(static_cast<char>(first)) !=
               std::string_view::npos) {
      name.remove_prefix(1);
      if (name.empty()) {
        return true;
      }
      return is_decimal_literal(name);
    }
    return true;
  }